

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sampleIsBetterPost(Stat4Accum *pAccum,Stat4Sample *pNew,Stat4Sample *pOld)

{
  long lVar1;
  
  lVar1 = (long)pNew->iCol;
  while( true ) {
    lVar1 = lVar1 + 1;
    if (pAccum->nCol <= lVar1) {
      return (uint)(pOld->iHash < pNew->iHash);
    }
    if (pOld->anEq[lVar1] < pNew->anEq[lVar1]) break;
    if (pNew->anEq[lVar1] < pOld->anEq[lVar1]) {
      return 0;
    }
  }
  return 1;
}

Assistant:

static int sampleIsBetterPost(
  Stat4Accum *pAccum, 
  Stat4Sample *pNew, 
  Stat4Sample *pOld
){
  int nCol = pAccum->nCol;
  int i;
  assert( pNew->iCol==pOld->iCol );
  for(i=pNew->iCol+1; i<nCol; i++){
    if( pNew->anEq[i]>pOld->anEq[i] ) return 1;
    if( pNew->anEq[i]<pOld->anEq[i] ) return 0;
  }
  if( pNew->iHash>pOld->iHash ) return 1;
  return 0;
}